

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stun_msg.c
# Opt level: O1

void stun_attr_errcode_init(stun_attr_errcode *attr,int err_code,char *err_reason,uint8_t pad)

{
  uint8_t uVar1;
  size_t sVar2;
  uint uVar3;
  
  sVar2 = strlen(err_reason);
  uVar3 = (int)sVar2 + 4;
  (attr->hdr).type = 0x900;
  (attr->hdr).length = (ushort)uVar3 << 8 | (ushort)uVar3 >> 8;
  attr->unused = 0;
  uVar1 = (uint8_t)(err_code / 100);
  attr->err_class = uVar1;
  attr->err_code = (char)err_code + uVar1 * -100;
  memcpy(attr->err_reason,err_reason,(long)(int)sVar2);
  if ((uVar3 & 3) != 0) {
    memset(attr->err_reason + ((ulong)(uVar3 & 0xffff) - 4),(uint)pad,
           4 - ((ulong)(uVar3 & 0xffff) & 3));
    return;
  }
  return;
}

Assistant:

void stun_attr_errcode_init(stun_attr_errcode *attr, int err_code,
                            const char *err_reason, uint8_t pad) {
  int reason_len = strlen(err_reason);
  uint8_t *p = (uint8_t *)attr;
  uint16_t attr_len = (uint16_t)(sizeof(attr->unused)
      + sizeof(attr->err_class) + sizeof(attr->err_code) + reason_len);
  stun_attr_hdr_init(&attr->hdr, STUN_ATTR_ERROR_CODE, attr_len);
  attr->unused = 0;
  attr->err_class = (uint8_t)(err_code / 100);
  attr->err_code = err_code % 100;
  memcpy(attr->err_reason, err_reason, reason_len);
  store_padding(p + sizeof(attr->hdr) + attr_len, attr_len, pad);
}